

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void findgotos(LexState *ls,Labeldesc *lb)

{
  Dyndata *pDVar1;
  int iVar2;
  int g;
  
  pDVar1 = ls->dyd;
  g = ls->fs->bl->firstgoto;
  iVar2 = (pDVar1->gt).n;
  if (g < iVar2) {
    do {
      if ((pDVar1->gt).arr[g].name == lb->name) {
        closegoto(ls,g,lb);
        iVar2 = (pDVar1->gt).n;
      }
      else {
        g = g + 1;
      }
    } while (g < iVar2);
  }
  return;
}

Assistant:

static void findgotos (LexState *ls, Labeldesc *lb) {
  Labellist *gl = &ls->dyd->gt;
  int i = ls->fs->bl->firstgoto;
  while (i < gl->n) {
    if (eqstr(gl->arr[i].name, lb->name))
      closegoto(ls, i, lb);
    else
      i++;
  }
}